

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateGeneralTests.cpp
# Opt level: O0

void __thiscall
vkt::DynamicState::anon_unknown_4::StateSwitchTestInstance::StateSwitchTestInstance
          (StateSwitchTestInstance *this,Context *context,ShaderMap *shaders)

{
  char *vertexShaderName;
  mapped_type *ppcVar1;
  Vec4 local_140;
  Vector<float,_4> local_130;
  PositionColorVertex local_120;
  deUint32 local_100;
  Vec4 local_fc;
  Vector<float,_4> local_ec;
  PositionColorVertex local_dc;
  deUint32 local_bc;
  Vec4 local_b8;
  Vector<float,_4> local_a8;
  PositionColorVertex local_98;
  deUint32 local_78;
  Vec4 local_74;
  Vector<float,_4> local_58;
  PositionColorVertex local_48;
  key_type local_28 [2];
  ShaderMap *local_20;
  ShaderMap *shaders_local;
  Context *context_local;
  StateSwitchTestInstance *this_local;
  
  local_28[1] = 0;
  local_20 = shaders;
  shaders_local = (ShaderMap *)context;
  context_local = (Context *)this;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](shaders,local_28 + 1);
  vertexShaderName = *ppcVar1;
  local_28[0] = SHADERTYPE_FRAGMENT;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](shaders,local_28);
  DynamicStateBaseClass::DynamicStateBaseClass
            (&this->super_DynamicStateBaseClass,context,vertexShaderName,*ppcVar1);
  (this->super_DynamicStateBaseClass).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__StateSwitchTestInstance_01668b80;
  (this->super_DynamicStateBaseClass).m_topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
  tcu::Vector<float,_4>::Vector(&local_58,-1.0,1.0,1.0,1.0);
  local_78 = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_74);
  PositionColorVertex::PositionColorVertex(&local_48,&local_58,&local_74);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DynamicStateBaseClass).m_data,&local_48);
  tcu::Vector<float,_4>::Vector(&local_a8,1.0,1.0,1.0,1.0);
  local_bc = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_b8);
  PositionColorVertex::PositionColorVertex(&local_98,&local_a8,&local_b8);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DynamicStateBaseClass).m_data,&local_98);
  tcu::Vector<float,_4>::Vector(&local_ec,-1.0,-1.0,1.0,1.0);
  local_100 = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_fc);
  PositionColorVertex::PositionColorVertex(&local_dc,&local_ec,&local_fc);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DynamicStateBaseClass).m_data,&local_dc);
  tcu::Vector<float,_4>::Vector(&local_130,1.0,-1.0,1.0,1.0);
  tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_140);
  PositionColorVertex::PositionColorVertex(&local_120,&local_130,&local_140);
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::push_back(&(this->super_DynamicStateBaseClass).m_data,&local_120);
  DynamicStateBaseClass::initialize(&this->super_DynamicStateBaseClass);
  return;
}

Assistant:

StateSwitchTestInstance (Context &context, ShaderMap shaders)
		: DynamicStateBaseClass (context, shaders[glu::SHADERTYPE_VERTEX], shaders[glu::SHADERTYPE_FRAGMENT])
	{
		m_topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;

		m_data.push_back(PositionColorVertex(tcu::Vec4(-1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(-1.0f, -1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(1.0f, -1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));

		DynamicStateBaseClass::initialize();
	}